

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_state_machine(tftp_state_data *state,tftp_event_t event)

{
  Curl_easy *data_00;
  Curl_easy *data;
  CURLcode result;
  tftp_event_t event_local;
  tftp_state_data *state_local;
  
  data._0_4_ = CURLE_OK;
  data_00 = state->data;
  switch(state->state) {
  case TFTP_STATE_START:
    data._0_4_ = tftp_send_first(state,event);
    break;
  case TFTP_STATE_RX:
    data._0_4_ = tftp_rx(state,event);
    break;
  case TFTP_STATE_TX:
    data._0_4_ = tftp_tx(state,event);
    break;
  case TFTP_STATE_FIN:
    if (((data_00 != (Curl_easy *)0x0) && ((*(ulong *)&(data_00->set).field_0x89c >> 0x1e & 1) != 0)
        ) && (((data_00->state).feat == (curl_trc_feat *)0x0 ||
              (0 < ((data_00->state).feat)->log_level)))) {
      Curl_infof(data_00,"%s","TFTP finished");
    }
    break;
  default:
    Curl_failf(data_00,"%s","Internal state machine error");
    data._0_4_ = CURLE_TFTP_ILLEGAL;
  }
  return (CURLcode)data;
}

Assistant:

static CURLcode tftp_state_machine(struct tftp_state_data *state,
                                   tftp_event_t event)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = state->data;

  switch(state->state) {
  case TFTP_STATE_START:
    DEBUGF(infof(data, "TFTP_STATE_START"));
    result = tftp_send_first(state, event);
    break;
  case TFTP_STATE_RX:
    DEBUGF(infof(data, "TFTP_STATE_RX"));
    result = tftp_rx(state, event);
    break;
  case TFTP_STATE_TX:
    DEBUGF(infof(data, "TFTP_STATE_TX"));
    result = tftp_tx(state, event);
    break;
  case TFTP_STATE_FIN:
    infof(data, "%s", "TFTP finished");
    break;
  default:
    DEBUGF(infof(data, "STATE: %d", state->state));
    failf(data, "%s", "Internal state machine error");
    result = CURLE_TFTP_ILLEGAL;
    break;
  }

  return result;
}